

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<std::tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>_>
* __thiscall
testing::internal::
ValuesInIteratorRangeGenerator<std::tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>_>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->
          super_ParamIteratorInterface<std::tuple<int,_int,_unsigned_int_(*)(const_unsigned_char_*,_int,_const_unsigned_char_*,_int),_int>_>
  ;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }